

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O1

void __thiscall icu_63::ICUService::ICUService(ICUService *this)

{
  ICUNotifier::ICUNotifier(&this->super_ICUNotifier);
  (this->super_ICUNotifier)._vptr_ICUNotifier = (_func_int **)&PTR__ICUService_0024cbe0;
  (this->name).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_0024a818;
  (this->name).fUnion.fStackFields.fLengthAndFlags = 2;
  this->timestamp = 0;
  this->factories = (UVector *)0x0;
  this->serviceCache = (Hashtable *)0x0;
  this->idCache = (Hashtable *)0x0;
  this->dnCache = (DNCache *)0x0;
  return;
}

Assistant:

ICUService::ICUService()
: name()
, timestamp(0)
, factories(NULL)
, serviceCache(NULL)
, idCache(NULL)
, dnCache(NULL)
{
}